

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O2

int comex_malloc(void **ptrs,size_t size,comex_group_t group)

{
  MPI_Comm poVar1;
  int iVar2;
  comex_igroup_t *pcVar3;
  void *pvVar4;
  int comm_rank;
  
  comm_rank = -1;
  if (ptrs == (void **)0x0) {
    __assert_fail("ptrs",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x867,"int comex_malloc(void **, size_t, comex_group_t)");
  }
  if (group < 0) {
    __assert_fail("group >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x868,"int comex_malloc(void **, size_t, comex_group_t)");
  }
  pcVar3 = comex_get_igroup_from_group(group);
  poVar1 = pcVar3->comm;
  if (poVar1 == (MPI_Comm)&ompi_mpi_comm_null) {
    __assert_fail("comm != MPI_COMM_NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x86c,"int comex_malloc(void **, size_t, comex_group_t)");
  }
  MPI_Comm_rank(poVar1,&comm_rank);
  pvVar4 = _my_malloc(size);
  ptrs[comm_rank] = pvVar4;
  comex_barrier(group);
  iVar2 = MPI_Allgather(1,0,&ompi_mpi_char,ptrs,8,&ompi_mpi_char,poVar1);
  if (iVar2 == 0) {
    return 0;
  }
  __assert_fail("MPI_SUCCESS == rc",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                ,0x875,"int comex_malloc(void **, size_t, comex_group_t)");
}

Assistant:

int comex_malloc(void **ptrs, size_t size, comex_group_t group)
{
    comex_igroup_t *igroup = NULL;
    MPI_Comm comm = MPI_COMM_NULL;
    int comm_rank = -1;
    int rc = MPI_SUCCESS; 

#if DEBUG
    printf("[%d] comex_malloc_group(ptrs=%p, size=%ld, ...)\n",
            l_state.rank, ptrs, size);
#endif

    /* preconditions */
    assert(ptrs);
    assert(group >= 0);
   
    igroup = comex_get_igroup_from_group(group);
    comm = igroup->comm;
    assert(comm != MPI_COMM_NULL);
    MPI_Comm_rank(comm, &comm_rank);

    /* allocate and register segment */
    ptrs[comm_rank] = comex_malloc_local(sizeof(char)*size);
  
    /* exchange buffer address */
    comex_barrier(group); /* end ARMCI epoch, enter MPI epoch */
    rc = MPI_Allgather(MPI_IN_PLACE, 0, MPI_CHAR, ptrs, SIZEOF_VOIDP, MPI_CHAR, comm);
    assert(MPI_SUCCESS == rc);
#if DEBUG
    {
        int i;
        int size;
        MPI_Comm_size(comm, &size);
        for (i=0; i<size; ++i) {
            printf("[%d] ptrs[%d]=%p\n", l_state.rank, i, ptrs[i]);
        }
    }
#endif

    /* TODO: This isn't needed! Right? The Allgather above is like a barrier */
    /*comex_barrier();*/

    return COMEX_SUCCESS;
}